

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ushort *__src;
  ulong uVar7;
  size_t l_1;
  ulong uVar8;
  void *__src_00;
  char *__dest;
  char *pcVar9;
  uint uVar10;
  size_t l;
  long lVar11;
  ulong uVar12;
  ushort *puVar13;
  char cVar14;
  int local_50;
  
  pcVar9 = dest + originalSize;
  __dest = dest;
  puVar13 = (ushort *)source;
  do {
    uVar2 = *puVar13;
    __src = (ushort *)((long)puVar13 + 1);
    uVar10 = (uint)(byte)((byte)uVar2 >> 4);
    uVar12 = (ulong)uVar10;
    if (uVar10 == 0xf) {
      lVar11 = 0;
      do {
        uVar3 = *__src;
        __src = (ushort *)((long)__src + 1);
        lVar11 = lVar11 + (ulong)(byte)uVar3;
      } while ((ulong)(byte)uVar3 == 0xff);
      uVar12 = lVar11 + 0xf;
    }
    cVar14 = '\0';
    if ((ulong)((long)pcVar9 - (long)__dest) < uVar12) {
      cVar14 = '\x01';
LAB_0010ee86:
      bVar1 = false;
    }
    else {
      memmove(__dest,__src,uVar12);
      __dest = __dest + uVar12;
      __src = (ushort *)((long)__src + uVar12);
      bVar1 = true;
      if ((ulong)((long)pcVar9 - (long)__dest) < 0xc) {
        cVar14 = (__dest == pcVar9) * '\x02' + '\x01';
        goto LAB_0010ee86;
      }
    }
    puVar13 = __src;
    if (bVar1) {
      uVar12 = (ulong)((byte)uVar2 & 0xf);
      puVar13 = __src + 1;
      if (uVar12 == 0xf) {
        lVar11 = 0;
        do {
          uVar2 = *puVar13;
          puVar13 = (ushort *)((long)puVar13 + 1);
          lVar11 = lVar11 + (ulong)(byte)uVar2;
        } while ((ulong)(byte)uVar2 == 0xff);
        uVar12 = lVar11 + 0xf;
      }
      uVar12 = uVar12 + 4;
      cVar14 = '\x01';
      if (uVar12 <= (ulong)((long)pcVar9 - (long)__dest)) {
        uVar7 = (ulong)*__src;
        uVar8 = (long)__dest - (long)dest;
        if (uVar7 <= uVar8 + dictSize) {
          if (uVar8 < uVar7) {
            __src_00 = (void *)((long)dictStart + (uVar8 - uVar7) + dictSize);
            uVar6 = (long)dictStart + (dictSize - (long)__src_00);
            uVar4 = uVar12 - uVar6;
            if (uVar12 < uVar6) {
              memmove(__dest,__src_00,uVar12);
              uVar4 = 0;
              uVar6 = uVar12;
            }
            else {
              memmove(__dest,__src_00,uVar6);
            }
            __dest = __dest + uVar6;
            pcVar5 = dest;
            uVar12 = uVar4;
          }
          else {
            pcVar5 = __dest + -uVar7;
          }
          if (uVar12 != 0) {
            uVar6 = 0;
            do {
              __dest[uVar6] = pcVar5[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar12 != uVar6);
          }
        }
        if (uVar7 <= uVar8 + dictSize) {
          __dest = __dest + uVar12;
          cVar14 = (ulong)((long)pcVar9 - (long)__dest) < 5;
        }
      }
    }
    if (cVar14 != '\0') {
      if (cVar14 == '\x03') {
        local_50 = (int)source;
        local_50 = (int)puVar13 - local_50;
      }
      else {
        local_50 = -1;
      }
      return local_50;
    }
  } while( true );
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                0, (const BYTE*)dictStart, dictSize);
}